

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O0

int __thiscall Indexing::ClauseCodeTree::remove(ClauseCodeTree *this,char *__filename)

{
  CodeOp *pCVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int extraout_EAX;
  LitInfo *pLVar5;
  Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
  *this_00;
  ILStruct *pIVar6;
  Stack<Indexing::CodeTree::CodeOp_*> *op_00;
  uint i_1;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  rrlm;
  RemovingLiteralMatcher *rlm;
  uint depth;
  CodeOp *op;
  uint i;
  CodeOp *op_1;
  uint clen;
  Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  rlms;
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  firstsInBlocks;
  CodeOp *in_stack_fffffffffffffe28;
  Stack<Indexing::CodeTree::CodeOp_*> *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  CodeTree *in_stack_fffffffffffffe40;
  Clause *in_stack_fffffffffffffe48;
  CodeOp *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  uint uVar7;
  RemovingLiteralMatcher *in_stack_fffffffffffffe70;
  RemovingMatcher<false> *in_stack_fffffffffffffe88;
  uint local_bc;
  RemovingLiteralMatcher *local_88;
  int local_7c;
  CodeTree *local_78;
  undefined8 local_70;
  FlatTerm *pFStack_68;
  bool local_60;
  uint local_58;
  
  if ((remove(Kernel::Clause*)::lInfos == '\0') &&
     (iVar3 = __cxa_guard_acquire(&remove(Kernel::Clause*)::lInfos), iVar3 != 0)) {
    Lib::DArray<Indexing::CodeTree::LitInfo>::DArray
              ((DArray<Indexing::CodeTree::LitInfo> *)in_stack_fffffffffffffe40,
               CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
    __cxa_atexit(Lib::DArray<Indexing::CodeTree::LitInfo>::~DArray,&remove::lInfos,&__dso_handle);
    __cxa_guard_release(&remove(Kernel::Clause*)::lInfos);
  }
  Lib::
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *)in_stack_fffffffffffffe30);
  Lib::
  Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)in_stack_fffffffffffffe30);
  uVar4 = Kernel::Clause::length((Clause *)__filename);
  Lib::DArray<Indexing::CodeTree::LitInfo>::ensure
            ((DArray<Indexing::CodeTree::LitInfo> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (size_t)in_stack_fffffffffffffe50);
  if (uVar4 != 0) {
    for (local_58 = 0; local_58 < uVar4; local_58 = local_58 + 1) {
      CodeTree::LitInfo::LitInfo
                ((LitInfo *)in_stack_fffffffffffffe40,
                 (Clause *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                 (uint)((ulong)in_stack_fffffffffffffe30 >> 0x20));
      pLVar5 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&remove::lInfos,(ulong)local_58)
      ;
      pLVar5->opposite = local_60;
      pLVar5->liIndex = (undefined4)local_70;
      pLVar5->litIndex = local_70._4_4_;
      pLVar5->ft = pFStack_68;
      pLVar5 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&remove::lInfos,(ulong)local_58)
      ;
      pLVar5->liIndex = local_58;
    }
    CodeTree::incTimeStamp(in_stack_fffffffffffffe40);
    local_78 = (CodeTree *)CodeTree::getEntryPoint((CodeTree *)0x2f5dde);
    Lib::
    Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::operator->((Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x2f5e05);
    Lib::Stack<Indexing::CodeTree::CodeOp_*>::push
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_7c = 0;
    do {
      Lib::
      Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                  *)in_stack_fffffffffffffe30);
      local_88 = Lib::
                 Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                 ::operator*((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                              *)0x2f5e59);
      Lib::DArray<Indexing::CodeTree::LitInfo>::array(&remove::lInfos);
      Lib::DArray<Indexing::CodeTree::LitInfo>::size(&remove::lInfos);
      Lib::
      Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::operator*((Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)0x2f5ecc);
      RemovingLiteralMatcher::init(local_88,(EVP_PKEY_CTX *)local_78);
      Lib::
      Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::operator->((Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x2f5f1a);
      Lib::
      Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                  *)in_stack_fffffffffffffe30,
                 (Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                  *)in_stack_fffffffffffffe28);
      Lib::
      Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
      ::push((Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
              *)in_stack_fffffffffffffe40,
             (Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
              *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      Lib::
      Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                   *)in_stack_fffffffffffffe70);
      Lib::
      Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                   *)in_stack_fffffffffffffe70);
      while( true ) {
        do {
          while (bVar2 = CodeTree::RemovingMatcher<false>::next(in_stack_fffffffffffffe88), !bVar2)
          {
            if (local_7c == 0) {
              Lib::
              Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
              ::~Recycled((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                           *)in_stack_fffffffffffffe70);
              Lib::
              Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              ::~Recycled((Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)in_stack_fffffffffffffe70);
              Lib::
              Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              ::~Recycled((Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)in_stack_fffffffffffffe70);
              goto LAB_002f6216;
            }
            in_stack_fffffffffffffe88 =
                 (RemovingMatcher<false> *)
                 Lib::
                 Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 ::operator->((Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                               *)0x2f5fe7);
            Lib::
            Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
            ::pop((Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                   *)in_stack_fffffffffffffe48);
            Lib::
            Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
            ::~Recycled((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                         *)in_stack_fffffffffffffe70);
            local_7c = local_7c + -1;
            this_00 = Lib::
                      Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                      ::operator->((Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                    *)0x2f602c);
            Lib::
            Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
            ::top(this_00);
            in_stack_fffffffffffffe70 =
                 Lib::
                 Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                 ::operator*((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                              *)0x2f604e);
            local_88 = in_stack_fffffffffffffe70;
          }
          pCVar1 = (local_88->super_RemovingMatcher<false>).super_BaseMatcher.op;
          pIVar6 = CodeTree::CodeOp::getILS((CodeOp *)0x2f6087);
        } while (pIVar6->timestamp == (this->super_CodeTree)._curTimeStamp);
        uVar7 = (this->super_CodeTree)._curTimeStamp;
        pIVar6 = CodeTree::CodeOp::getILS((CodeOp *)0x2f60c4);
        pIVar6->timestamp = uVar7;
        local_78 = (CodeTree *)(pCVar1 + 1);
        if (local_7c != uVar4 - 1) break;
        in_stack_fffffffffffffe48 = (Clause *)__filename;
        op_00 = Lib::
                Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                ::operator*((Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                             *)0x2f6127);
        in_stack_fffffffffffffe3f =
             removeOneOfAlternatives
                       ((ClauseCodeTree *)CONCAT44(uVar7,in_stack_fffffffffffffe58),(CodeOp *)op_00,
                        in_stack_fffffffffffffe48,(Stack<Indexing::CodeTree::CodeOp_*> *)local_78);
        in_stack_fffffffffffffe40 = local_78;
        if ((bool)in_stack_fffffffffffffe3f) {
          for (local_bc = 0; local_bc < uVar4; local_bc = local_bc + 1) {
            Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&remove::lInfos,(ulong)local_bc);
            CodeTree::LitInfo::dispose((LitInfo *)0x2f61b8);
          }
          goto LAB_002f61da;
        }
      }
      local_7c = local_7c + 1;
    } while( true );
  }
  CodeTree::getEntryPoint((CodeTree *)0x2f5bdb);
  Lib::
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  operator->((Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)0x2f5c02);
  Lib::Stack<Indexing::CodeTree::CodeOp_*>::push
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  Lib::
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  operator*((Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             *)0x2f5c50);
  bVar2 = removeOneOfAlternatives
                    ((ClauseCodeTree *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)
                     ,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                     (Stack<Indexing::CodeTree::CodeOp_*> *)in_stack_fffffffffffffe40);
  if (bVar2) {
LAB_002f61da:
    Lib::
    Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)in_stack_fffffffffffffe70);
    Lib::
    Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)in_stack_fffffffffffffe70);
    return extraout_EAX;
  }
  __cxa_guard_abort(&remove(Kernel::Clause*)::lInfos);
LAB_002f6216:
  _Unwind_Resume(bVar2);
}

Assistant:

void ClauseCodeTree::remove(Clause* cl)
{
  static DArray<LitInfo> lInfos;
  Recycled<Stack<CodeOp*>> firstsInBlocks;
  Recycled<Stack<Recycled<RemovingLiteralMatcher, NoReset>>> rlms;

  unsigned clen=cl->length();
  lInfos.ensure(clen);

  if(!clen) {
    CodeOp* op=getEntryPoint();
    firstsInBlocks->push(op);
    if(!removeOneOfAlternatives(op, cl, &*firstsInBlocks)) {
      ASSERTION_VIOLATION;
      INVALID_OPERATION("empty clause to be removed was not found");
    }
    return;
  }

  for(unsigned i=0;i<clen;i++) {
    lInfos[i]=LitInfo(cl,i);
    lInfos[i].liIndex=i;
  }
  incTimeStamp();

  CodeOp* op=getEntryPoint();
  firstsInBlocks->push(op);
  unsigned depth=0;
  for(;;) {
    RemovingLiteralMatcher* rlm = 0;
    {
      Recycled<RemovingLiteralMatcher, NoReset> rrlm; // take rlm out of recycling
      rlm = &*rrlm; // get the actual content (also to use after this initialization block)
      rlm->init(op, lInfos.array(), lInfos.size(), this, &*firstsInBlocks); // init it
      rlms->push(std::move(rrlm)); // store it in rlms (along with the obligation to return to recycling when no longer used)
    }

  iteration_restart:
    if(!rlm->next()) {
      if(depth==0) {
        ASSERTION_VIOLATION;
        INVALID_OPERATION("clause to be removed was not found");
      }
      rlms->pop();
      depth--;
      rlm = &*rlms->top();
      goto iteration_restart;
    }

    op=rlm->op;
    ASS(op->isLitEnd());
    ASS_EQ(op->getILS()->depth, depth);

    if(op->getILS()->timestamp==_curTimeStamp) {
      //we have already been here
      goto iteration_restart;
    }
    op->getILS()->timestamp=_curTimeStamp;

    op++;
    if(depth==clen-1) {
      if(removeOneOfAlternatives(op, cl, &*firstsInBlocks)) {
        //successfully removed
        break;
      }
      goto iteration_restart;
    }
    ASS_L(depth,clen-1);
    depth++;
  }

  for(unsigned i=0;i<clen;i++) {
    lInfos[i].dispose();
  }
}